

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O1

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte bVar2;
  uInt uVar3;
  uint uVar4;
  internal_state *piVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  ulg uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  byte *pbVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *pbVar27;
  ulong uVar28;
  int local_38;
  
  piVar5 = strm->state;
  pbVar19 = strm->next_in;
  pbVar25 = pbVar19 + (strm->avail_in - 5);
  pbVar6 = strm->next_out;
  uVar3 = strm->avail_out;
  local_38 = (int)pbVar6 - (start - uVar3);
  iVar17 = *(int *)((long)&piVar5->gzhead + 4);
  uVar10 = piVar5->gzindex;
  uVar4 = *(uint *)((long)&piVar5->gzindex + 4);
  pbVar7 = *(byte **)&piVar5->method;
  uVar28 = *(ulong *)piVar5->crc0;
  uVar11 = piVar5->crc0[10];
  uVar12 = piVar5->crc0[0xb];
  uVar13 = piVar5->crc0[2];
  lVar8 = *(long *)(piVar5->crc0 + 6);
  lVar9 = *(long *)(piVar5->crc0 + 8);
  pbVar26 = pbVar6;
LAB_0010c3b3:
  if (uVar13 < 0xf) {
    bVar2 = *pbVar19;
    pbVar24 = pbVar19 + 1;
    pbVar19 = pbVar19 + 2;
    uVar28 = ((ulong)*pbVar24 << ((byte)uVar13 + 8 & 0x3f)) +
             ((ulong)bVar2 << ((byte)uVar13 & 0x3f)) + uVar28;
    uVar13 = uVar13 | 0x10;
  }
  pbVar24 = (byte *)((ulong)((uint)uVar28 & ~(-1 << ((byte)uVar11 & 0x1f))) * 4 + lVar8);
  while( true ) {
    uVar28 = uVar28 >> (pbVar24[1] & 0x3f);
    uVar13 = uVar13 - pbVar24[1];
    bVar2 = *pbVar24;
    if (bVar2 == 0) break;
    pbVar27 = pbVar26;
    if ((bVar2 & 0x10) != 0) {
      uVar20 = (uint)*(ushort *)(pbVar24 + 2);
      uVar16 = bVar2 & 0xf;
      if ((bVar2 & 0xf) != 0) {
        if (uVar13 < uVar16) {
          bVar2 = *pbVar19;
          pbVar19 = pbVar19 + 1;
          uVar28 = uVar28 + ((ulong)bVar2 << ((byte)uVar13 & 0x3f));
          uVar13 = uVar13 + 8;
        }
        uVar20 = (uint)*(ushort *)(pbVar24 + 2) + (~(-1 << (sbyte)uVar16) & (uint)uVar28);
        uVar28 = uVar28 >> (sbyte)uVar16;
        uVar13 = uVar13 - uVar16;
      }
      if (uVar13 < 0xf) {
        bVar2 = *pbVar19;
        pbVar24 = pbVar19 + 1;
        pbVar19 = pbVar19 + 2;
        uVar28 = ((ulong)*pbVar24 << ((byte)uVar13 + 8 & 0x3f)) +
                 ((ulong)bVar2 << ((byte)uVar13 & 0x3f)) + uVar28;
        uVar13 = uVar13 | 0x10;
      }
      pbVar24 = (byte *)(lVar9 + (ulong)((uint)uVar28 & ~(-1 << ((byte)uVar12 & 0x1f))) * 4);
      uVar28 = uVar28 >> (pbVar24[1] & 0x3f);
      uVar13 = uVar13 - pbVar24[1];
      bVar2 = *pbVar24;
      goto LAB_0010c4cd;
    }
    if ((bVar2 & 0x40) != 0) {
      iVar17 = 0x3f3f;
      if ((bVar2 & 0x20) != 0) goto LAB_0010c7ad;
      pcVar15 = "invalid literal/length code";
      goto LAB_0010c7a4;
    }
    pbVar24 = (byte *)((ulong)*(ushort *)(pbVar24 + 2) * 4 + lVar8 +
                      (ulong)(~(-1 << (bVar2 & 0x1f)) & (uint)uVar28) * 4);
  }
  *pbVar26 = pbVar24[2];
  goto LAB_0010c42d;
LAB_0010c4cd:
  if ((bVar2 & 0x10) != 0) goto LAB_0010c50c;
  if ((bVar2 & 0x40) != 0) {
    pcVar15 = "invalid distance code";
    goto LAB_0010c7a4;
  }
  pbVar24 = (byte *)(lVar9 + (ulong)*(ushort *)(pbVar24 + 2) * 4 +
                    (ulong)(~(-1 << (bVar2 & 0x1f)) & (uint)uVar28) * 4);
  uVar28 = uVar28 >> (pbVar24[1] & 0x3f);
  uVar13 = uVar13 - pbVar24[1];
  bVar2 = *pbVar24;
  goto LAB_0010c4cd;
LAB_0010c50c:
  uVar16 = bVar2 & 0xf;
  if (uVar13 < uVar16) {
    uVar28 = ((ulong)*pbVar19 << ((byte)uVar13 & 0x3f)) + uVar28;
    uVar21 = uVar13 + 8;
    if (uVar21 < uVar16) {
      pbVar1 = pbVar19 + 1;
      pbVar19 = pbVar19 + 2;
      uVar28 = uVar28 + ((ulong)*pbVar1 << ((byte)uVar21 & 0x3f));
      uVar13 = uVar13 + 0x10;
    }
    else {
      pbVar19 = pbVar19 + 1;
      uVar13 = uVar21;
    }
  }
  uVar23 = (~(-1 << (sbyte)uVar16) & (uint)uVar28) + (uint)*(ushort *)(pbVar24 + 2);
  uVar28 = uVar28 >> (sbyte)uVar16;
  uVar13 = uVar13 - uVar16;
  uVar16 = (int)pbVar26 - local_38;
  uVar21 = uVar23 - uVar16;
  if (uVar23 < uVar16 || uVar21 == 0) {
    uVar14 = (ulong)uVar23;
    lVar22 = 0;
    uVar16 = uVar20;
    do {
      lVar18 = lVar22;
      pbVar26[lVar18] = pbVar26[lVar18 - uVar14];
      pbVar26[lVar18 + 1] = pbVar26[lVar18 + (1 - uVar14)];
      pbVar26[lVar18 + 2] = pbVar26[lVar18 + (2 - uVar14)];
      uVar16 = uVar16 - 3;
      lVar22 = lVar18 + 3;
    } while (2 < uVar16);
    if ((uint)lVar22 == uVar20) {
      pbVar27 = pbVar26 + lVar22;
    }
    else {
      pbVar26[lVar22] = pbVar26[lVar22 + -uVar14];
      if ((uint)lVar22 - uVar20 == -2) {
        pbVar27 = pbVar26 + lVar18 + 5;
        pbVar26[lVar18 + 4] = pbVar26[-uVar14 + 1 + lVar22];
      }
      else {
        pbVar27 = pbVar26 + lVar18 + 4;
      }
    }
    goto LAB_0010c430;
  }
  if (((uint)uVar10 < uVar21) && (piVar5[1].d_desc.max_code != 0)) {
    pcVar15 = "invalid distance too far back";
LAB_0010c7a4:
    strm->msg = pcVar15;
    iVar17 = 0x3f51;
LAB_0010c7ad:
    piVar5->status = iVar17;
LAB_0010c7b1:
    strm->next_in = pbVar19 + -(ulong)(uVar13 >> 3);
    strm->next_out = pbVar27;
    strm->avail_in = ((int)pbVar25 - (int)(pbVar19 + -(ulong)(uVar13 >> 3))) + 5;
    strm->avail_out = ((int)(pbVar6 + (uVar3 - 0x101)) - (int)pbVar27) + 0x101;
    *(ulong *)piVar5->crc0 = (ulong)((uint)uVar28 & ~(-1 << (sbyte)(uVar13 & 7)));
    piVar5->crc0[2] = uVar13 & 7;
    return;
  }
  if (uVar4 == 0) {
    pbVar24 = pbVar7 + (iVar17 - uVar21);
    uVar16 = uVar20 - uVar21;
    if (uVar21 <= uVar20 && uVar16 != 0) {
      lVar22 = 0;
      do {
        *pbVar26 = pbVar24[lVar22];
        pbVar26 = pbVar26 + 1;
        lVar22 = lVar22 + 1;
      } while (uVar21 != (uint)lVar22);
LAB_0010c6f5:
      pbVar24 = pbVar26 + -(ulong)uVar23;
      pbVar27 = pbVar26;
      uVar20 = uVar16;
    }
  }
  else if (uVar4 < uVar21) {
    pbVar24 = pbVar7 + ((uVar4 + iVar17) - uVar21);
    uVar21 = uVar21 - uVar4;
    uVar16 = uVar20 - uVar21;
    if (uVar21 <= uVar20 && uVar16 != 0) {
      lVar22 = 0;
      do {
        pbVar26[lVar22] = pbVar24[lVar22];
        lVar22 = lVar22 + 1;
      } while (uVar21 != (uint)lVar22);
      pbVar26 = pbVar26 + lVar22;
      pbVar24 = pbVar7;
      pbVar27 = pbVar26;
      uVar20 = uVar16;
      if (uVar4 < uVar16) {
        lVar22 = 0;
        do {
          *pbVar26 = pbVar7[lVar22];
          pbVar26 = pbVar26 + 1;
          lVar22 = lVar22 + 1;
        } while (uVar4 != (uint)lVar22);
        uVar16 = uVar16 - uVar4;
        goto LAB_0010c6f5;
      }
    }
  }
  else {
    pbVar24 = pbVar7 + (uVar4 - uVar21);
    uVar16 = uVar20 - uVar21;
    if (uVar21 <= uVar20 && uVar16 != 0) {
      lVar22 = 0;
      do {
        *pbVar26 = pbVar24[lVar22];
        pbVar26 = pbVar26 + 1;
        lVar22 = lVar22 + 1;
      } while (uVar21 != (uint)lVar22);
      goto LAB_0010c6f5;
    }
  }
  for (; 2 < uVar20; uVar20 = uVar20 - 3) {
    *pbVar27 = *pbVar24;
    pbVar27[1] = pbVar24[1];
    pbVar27[2] = pbVar24[2];
    pbVar24 = pbVar24 + 3;
    pbVar27 = pbVar27 + 3;
  }
  if (uVar20 != 0) {
    *pbVar27 = *pbVar24;
    pbVar26 = pbVar27;
    if (uVar20 == 2) {
      pbVar27[1] = pbVar24[1];
      pbVar27 = pbVar27 + 2;
    }
    else {
LAB_0010c42d:
      pbVar27 = pbVar26 + 1;
    }
  }
LAB_0010c430:
  if ((pbVar25 <= pbVar19) || (pbVar26 = pbVar27, pbVar6 + (uVar3 - 0x101) <= pbVar27))
  goto LAB_0010c7b1;
  goto LAB_0010c3b3;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(z_streamp strm, unsigned start) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code const *here;           /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - (INFLATE_FAST_MIN_INPUT - 1));
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - (INFLATE_FAST_MIN_OUTPUT - 1));
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode + (hold & lmask);
      dolen:
        op = (unsigned)(here->bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here->op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here->val >= 0x20 && here->val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here->val));
            *out++ = (unsigned char)(here->val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here->val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode + (hold & dmask);
          dodist:
            op = (unsigned)(here->bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here->op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here->val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode + here->val + (hold & ((1U << op) - 1));
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode + here->val + (hold & ((1U << op) - 1));
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ?
        (INFLATE_FAST_MIN_INPUT - 1) + (last - in) :
        (INFLATE_FAST_MIN_INPUT - 1) - (in - last));
    strm->avail_out = (unsigned)(out < end ?
        (INFLATE_FAST_MIN_OUTPUT - 1) + (end - out) :
        (INFLATE_FAST_MIN_OUTPUT - 1) - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}